

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableRemove(ImGuiTable *table)

{
  ImPool<ImGuiTable> *this;
  ImGuiContext *pIVar1;
  ImPoolIdx i;
  float *pfVar2;
  
  pIVar1 = GImGui;
  this = &GImGui->Tables;
  i = ImPool<ImGuiTable>::GetIndex(this,table);
  ImPool<ImGuiTable>::Remove(this,table->ID,table);
  pfVar2 = ImVector<float>::operator[](&pIVar1->TablesLastTimeActive,i);
  *pfVar2 = -1.0;
  return;
}

Assistant:

void ImGui::TableRemove(ImGuiTable* table)
{
    //IMGUI_DEBUG_LOG("TableRemove() id=0x%08X\n", table->ID);
    ImGuiContext& g = *GImGui;
    int table_idx = g.Tables.GetIndex(table);
    //memset(table->RawData.Data, 0, table->RawData.size_in_bytes());
    //memset(table, 0, sizeof(ImGuiTable));
    g.Tables.Remove(table->ID, table);
    g.TablesLastTimeActive[table_idx] = -1.0f;
}